

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

JsonNode * jsonLookupAppend(JsonParse *pParse,char *zPath,int *pApnd,char **pzErr)

{
  int iVar1;
  JsonNode *pJVar2;
  u32 eType;
  
  *pApnd = 1;
  if (*zPath == '.') {
    eType = 7;
  }
  else {
    if (*zPath == '\0') {
      jsonParseAddNode(pParse,0,0,(char *)0x0);
      if (pParse->oom != '\0') {
        return (JsonNode *)0x0;
      }
      return pParse->aNode + (pParse->nNode - 1);
    }
    iVar1 = strncmp(zPath,"[0]",3);
    if (iVar1 != 0) {
      return (JsonNode *)0x0;
    }
    eType = 6;
  }
  jsonParseAddNode(pParse,eType,0,(char *)0x0);
  if (pParse->oom != '\0') {
    return (JsonNode *)0x0;
  }
  pJVar2 = jsonLookupStep(pParse,pParse->nNode - 1,zPath,pApnd,pzErr);
  return pJVar2;
}

Assistant:

static JsonNode *jsonLookupAppend(
  JsonParse *pParse,     /* Append content to the JSON parse */
  const char *zPath,     /* Description of content to append */
  int *pApnd,            /* Set this flag to 1 */
  const char **pzErr     /* Make this point to any syntax error */
){
  *pApnd = 1;
  if( zPath[0]==0 ){
    jsonParseAddNode(pParse, JSON_NULL, 0, 0);
    return pParse->oom ? 0 : &pParse->aNode[pParse->nNode-1];
  }
  if( zPath[0]=='.' ){
    jsonParseAddNode(pParse, JSON_OBJECT, 0, 0);
  }else if( strncmp(zPath,"[0]",3)==0 ){
    jsonParseAddNode(pParse, JSON_ARRAY, 0, 0);
  }else{
    return 0;
  }
  if( pParse->oom ) return 0;
  return jsonLookupStep(pParse, pParse->nNode-1, zPath, pApnd, pzErr);
}